

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

Image * vera::toSdfLayer(Image *__return_storage_ptr__,BVH *_acc,size_t _voxel_resolution,
                        size_t _z_layer,float _refinement)

{
  Material *this;
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  vec3 vVar4;
  float local_174;
  thread *t_2;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  Image *local_148;
  int local_140;
  int local_13c;
  size_t local_138;
  size_t local_130;
  float local_128;
  vec<3,_float,_(glm::qualifier)0> local_124;
  float local_118;
  float local_114;
  thread local_110;
  thread t_1;
  thread local_c8;
  thread t;
  int end_row;
  int start_row;
  int i;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  string local_90;
  byte local_5e;
  byte local_5d;
  float local_5c;
  undefined1 auStack_58 [2];
  bool RGBD;
  float max_dist;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_50;
  undefined1 local_48 [8];
  vec3 bdiagonal;
  int layersLeftOver;
  int layersPerThread;
  int nThreads;
  float voxel_size;
  float _refinement_local;
  size_t _z_layer_local;
  size_t _voxel_resolution_local;
  BVH *_acc_local;
  Image *layer;
  
  local_174 = (float)_voxel_resolution;
  layersLeftOver = std::thread::hardware_concurrency();
  iVar2 = (int)_voxel_resolution;
  if (_voxel_resolution < (ulong)(long)layersLeftOver) {
    layersLeftOver = iVar2;
  }
  bdiagonal.field_2 = SUB84(_voxel_resolution / (ulong)(long)layersLeftOver,0);
  bdiagonal.field_1 = SUB84(_voxel_resolution % (ulong)(long)layersLeftOver,0);
  vVar4 = BoundingBox::getDiagonal(&_acc->super_BoundingBox);
  local_50 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar4.field_2;
  bdiagonal.field_0 = local_50;
  _auStack_58 = vVar4._0_8_;
  local_48._0_4_ = _auStack_58;
  local_48._4_4_ = max_dist;
  _auStack_58 = vVar4;
  local_5c = glm::length<3,float,(glm::qualifier)0>((vec<3,_float,_(glm::qualifier)0> *)local_48);
  local_5c = local_5c * 0.5;
  local_5d = 0;
  Image::Image(__return_storage_ptr__,iVar2,iVar2,4);
  pvVar3 = std::vector<vera::Triangle,_std::allocator<vera::Triangle>_>::operator[]
                     (&_acc->elements,0);
  local_5e = Triangle::haveColors(pvVar3);
  if ((!(bool)local_5e) &&
     (pvVar3 = std::vector<vera::Triangle,_std::allocator<vera::Triangle>_>::operator[]
                         (&_acc->elements,0), pvVar3->material != (Material *)0x0)) {
    pvVar3 = std::vector<vera::Triangle,_std::allocator<vera::Triangle>_>::operator[]
                       (&_acc->elements,0);
    this = pvVar3->material;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_90,"diffuse",
               (allocator *)
               ((long)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 7));
    bVar1 = Material::haveProperty(this,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 7));
    if (bVar1) {
      local_5e = 1;
    }
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&start_row);
  for (end_row = 0; end_row < layersLeftOver; end_row = end_row + 1) {
    iVar2 = end_row * (int)bdiagonal.field_2;
    t._M_id._M_thread._4_4_ = iVar2 + (int)bdiagonal.field_2;
    if (end_row == layersLeftOver + -1) {
      t._M_id._M_thread._4_4_ = iVar2 + (int)bdiagonal.field_2 + (int)bdiagonal.field_1;
    }
    if ((local_5e & 1) == 0) {
      local_13c = t._M_id._M_thread._4_4_;
      local_124.field_2.z = bdiagonal.field_0.x;
      local_124.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_48._0_4_;
      local_124.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_48._4_4_;
      local_118 = local_5c;
      __range1 = (vector<std::thread,_std::allocator<std::thread>_> *)_acc;
      local_148 = __return_storage_ptr__;
      local_140 = iVar2;
      local_138 = _z_layer;
      local_130 = _voxel_resolution;
      local_128 = 1.0 / local_174;
      local_114 = _refinement;
      std::thread::
      thread<vera::toSdfLayer(vera::BVH_const*,unsigned_long,unsigned_long,float)::__1,,void>
                (&local_110,(type *)&__range1);
      std::vector<std::thread,_std::allocator<std::thread>_>::push_back
                ((vector<std::thread,_std::allocator<std::thread>_> *)&start_row,&local_110);
      std::thread::~thread(&local_110);
    }
    else {
      t_1._M_id._M_thread = (id)(id)_acc;
      std::thread::
      thread<vera::toSdfLayer(vera::BVH_const*,unsigned_long,unsigned_long,float)::__0,,void>
                (&local_c8,(type *)&t_1);
      std::vector<std::thread,_std::allocator<std::thread>_>::push_back
                ((vector<std::thread,_std::allocator<std::thread>_> *)&start_row,&local_c8);
      std::thread::~thread(&local_c8);
    }
  }
  __end1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                     ((vector<std::thread,_std::allocator<std::thread>_> *)&start_row);
  t_2 = (thread *)
        std::vector<std::thread,_std::allocator<std::thread>_>::end
                  ((vector<std::thread,_std::allocator<std::thread>_> *)&start_row);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                     *)&t_2), bVar1) {
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&__end1);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end1);
  }
  local_5d = 1;
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&start_row);
  if ((local_5d & 1) == 0) {
    Image::~Image(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Image toSdfLayer( const BVH* _acc, size_t _voxel_resolution, size_t _z_layer, float _refinement) {
    float voxel_size    = 1.0/float(_voxel_resolution);
    int nThreads  = std::thread::hardware_concurrency();

    if (nThreads > _voxel_resolution)
        nThreads = _voxel_resolution;

    int layersPerThread = _voxel_resolution / nThreads;
    int layersLeftOver  = _voxel_resolution % nThreads;
    glm::vec3 bdiagonal = _acc->getDiagonal();
    float max_dist      = glm::length(bdiagonal) * 0.5f;

    Image layer = Image(_voxel_resolution, _voxel_resolution, 4);

    bool RGBD = _acc->elements[0].haveColors();
    if (!RGBD && _acc->elements[0].material != nullptr)
        if (_acc->elements[0].material->haveProperty("diffuse"))
            RGBD = true;
    // RGBD = false;

    std::vector<std::thread> threads;
    for (int i = 0; i < nThreads; ++i) {
        int start_row = i * layersPerThread;
        int end_row = start_row + layersPerThread;
        if (i == nThreads - 1)
            end_row = start_row + layersPerThread + layersLeftOver;


        if (RGBD) {
            std::thread t(
                [_acc, &layer, start_row, end_row, _z_layer, _voxel_resolution, voxel_size, bdiagonal, max_dist, _refinement]() {
                    for (int y = start_row; y < end_row; y++)
                    for (int x = 0; x < _voxel_resolution; x++) {
                        glm::vec3 p = (glm::vec3(x, y, _z_layer) + 0.5f) * voxel_size;
                        p = _acc->min + p * bdiagonal;

                        glm::vec4 c = _acc->getClosestRGBSignedDistance(p, max_dist * _refinement);

                        c.a = glm::clamp(c.a/max_dist, -1.0f, 1.0f) * 0.5 + 0.5;
                        size_t index = layer.getIndex(x, y);

                        layer.setColor(index, c);
                    }
                }
            );
            threads.push_back(std::move(t));
        }
        else {
            std::thread t(
                [_acc, &layer, start_row, end_row, _z_layer, _voxel_resolution, voxel_size, bdiagonal, max_dist, _refinement]() {
                    for (int y = start_row; y < end_row; y++)
                    for (int x = 0; x < _voxel_resolution; x++) {

                        glm::vec3 p = (glm::vec3(x, y, _z_layer) + 0.5f) * voxel_size;
                        p = _acc->min + p * bdiagonal;

                        glm::vec4 c = glm::vec4( 1.0f, 1.0f, 1.0f, _acc->getClosestSignedDistance(p, max_dist * _refinement) );

                        c.a = glm::clamp(c.a/max_dist, -1.0f, 1.0f) * 0.5 + 0.5;
                        size_t index = layer.getIndex(x, y);

                        layer.setColor(index, c);
                    }
                }
            );
            threads.push_back(std::move(t));
        }
    }

    for (std::thread& t : threads)
        t.join();

    return layer;
}